

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O2

void __thiscall tst_qpromise_operators::copy_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  char cVar2;
  bool bVar3;
  QThread *pQVar4;
  QObject *pQVar5;
  QEvent *pQVar6;
  PromiseData<void> *this_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar7;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a0;
  QPromiseBase<void> local_98;
  PromiseResolver<void> resolver_1;
  QPromise<void> p1;
  QPromise<void> p0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_60;
  QPromiseBase<void> local_58;
  QWeakPointer<QObject> local_48;
  QPromiseBase<void> local_38;
  
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119ae0;
  pQVar4 = (QThread *)operator_new(0x58);
  *(undefined8 *)pQVar4 = 0;
  *(undefined8 *)(pQVar4 + 8) = 0;
  *(undefined8 *)(pQVar4 + 0x10) = 0;
  *(undefined8 *)(pQVar4 + 0x18) = 0;
  *(undefined8 *)(pQVar4 + 0x20) = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)(pQVar4 + 0x28) =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)(pQVar4 + 0x30) = 0;
  *(undefined8 *)(pQVar4 + 0x38) = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   (pQVar4 + 0x40) =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  *(qsizetype *)(pQVar4 + 0x48) = 0;
  *(exception_ptr *)(pQVar4 + 0x50) = (exception_ptr)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)pQVar4);
  LOCK();
  *(int *)(pQVar4 + 8) = (int)*(QAtomicInt *)(pQVar4 + 8) + 1;
  UNLOCK();
  if (pQVar4 != (QThread *)0x0) {
    LOCK();
    *(int *)(pQVar4 + 8) = (int)*(QAtomicInt *)(pQVar4 + 8) + 1;
    UNLOCK();
  }
  local_58._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119a98;
  p0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pQVar4;
  local_58.m_d.d = (PromiseData<void> *)pQVar4;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&p1,(QPromise<void> *)&local_58);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_58);
  if (p1.super_QPromiseBase<void>._vptr_QPromiseBase == (_func_int **)0x0) {
    p1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)p1.super_QPromiseBase<void>._vptr_QPromiseBase =
         *(int *)p1.super_QPromiseBase<void>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if ((Data *)p1.super_QPromiseBase<void>._vptr_QPromiseBase == (Data *)0x0) {
    local_98._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    (((Data *)p1.super_QPromiseBase<void>._vptr_QPromiseBase)->super_QSharedData).ref.
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((Data *)p1.super_QPromiseBase<void>._vptr_QPromiseBase)->super_QSharedData).ref.
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_98._vptr_QPromiseBase = p1.super_QPromiseBase<void>._vptr_QPromiseBase;
  }
  local_a0.d = (Data *)0x0;
  if ((Data *)local_98._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((Data *)local_98._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_98._vptr_QPromiseBase)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.d = (Data *)p1.super_QPromiseBase<void>._vptr_QPromiseBase;
  local_60.d = (Data *)local_98._vptr_QPromiseBase;
  pQVar4 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_48,pQVar4);
  if (((local_48.d != (Data *)0x0) &&
      (local_48.value != (QObject *)0x0 && *(int *)(local_48.d + 4) != 0)) &&
     (cVar2 = QThread::isFinished(), cVar2 == '\0')) {
    if ((local_48.d == (Data *)0x0) || (*(int *)(local_48.d + 4) == 0)) {
      local_48.value = (QObject *)0x0;
    }
    pQVar5 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_48.value);
    if ((pQVar5 != (QObject *)0x0) || (cVar2 = QCoreApplication::closingDown(), cVar2 == '\0')) {
      pQVar6 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(pQVar6,None);
      *(undefined ***)pQVar6 = &PTR__Event_00119960;
      *(_func_int ***)(pQVar6 + 0x10) = local_98._vptr_QPromiseBase;
      if ((Data *)local_98._vptr_QPromiseBase != (Data *)0x0) {
        LOCK();
        (((QSharedData *)local_98._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((QSharedData *)local_98._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar5,pQVar6,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_60);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)&p1);
  p0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119a98;
  p1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119ae0;
  this_00 = (PromiseData<void> *)operator_new(0x58);
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_00->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_00->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119a98;
  local_98.m_d.d = this_00;
  p1.super_QPromiseBase<void>.m_d.d = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&local_98);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_98);
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_a8.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_a8 = resolver_1.m_d.d;
  }
  local_a0.d = (Data *)0x0;
  if (local_a8.d != (Data *)0x0) {
    LOCK();
    ((local_a8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_a8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_60.d = local_a8.d;
  pQVar4 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_58,pQVar4);
  if (((local_58._vptr_QPromiseBase != (_func_int **)0x0) &&
      ((QThread *)local_58.m_d.d != (QThread *)0x0 &&
       *(int *)((long)local_58._vptr_QPromiseBase + 4) != 0)) &&
     (cVar2 = QThread::isFinished(), cVar2 == '\0')) {
    if ((local_58._vptr_QPromiseBase == (_func_int **)0x0) ||
       (QVar7.d = local_58.m_d.d, *(int *)((long)local_58._vptr_QPromiseBase + 4) == 0)) {
      QVar7.d = (PromiseData<void> *)(QThread *)0x0;
    }
    pQVar5 = (QObject *)QAbstractEventDispatcher::instance((QThread *)QVar7.d);
    if ((pQVar5 != (QObject *)0x0) || (cVar2 = QCoreApplication::closingDown(), cVar2 == '\0')) {
      pQVar6 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(pQVar6,None);
      *(undefined ***)pQVar6 = &PTR__Event_001199a8;
      *(Data **)(pQVar6 + 0x10) = local_a8.d;
      if (local_a8.d != (Data *)0x0) {
        LOCK();
        ((local_a8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar5,pQVar6,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_58);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_60);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119a98;
  local_a8.d = local_a8.d & 0xffffffffffffff00;
  local_98._vptr_QPromiseBase._0_1_ =
       p0.super_QPromiseBase<void>.m_d.d == p1.super_QPromiseBase<void>.m_d.d;
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)&local_98,(bool *)&local_a8,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x82);
  if (bVar3) {
    local_98._vptr_QPromiseBase._0_1_ =
         QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                   (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    local_a8.d._0_1_ = 1;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&local_98,(bool *)&local_a8,"p0.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0x83);
    if (bVar3) {
      local_98._vptr_QPromiseBase._0_1_ =
           QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                     (&(p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
      local_a8.d._0_1_ = 1;
      bVar3 = QTest::qCompare<bool,bool>
                        ((bool *)&local_98,(bool *)&local_a8,"p1.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x84);
      if (bVar3) {
        QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>::reset
                  (&p0.super_QPromiseBase<void>.m_d,p1.super_QPromiseBase<void>.m_d.d);
        local_98._vptr_QPromiseBase._0_1_ =
             p0.super_QPromiseBase<void>.m_d.d == p1.super_QPromiseBase<void>.m_d.d;
        local_a8.d._0_1_ = 1;
        bVar3 = QTest::qCompare<bool,bool>
                          ((bool *)&local_98,(bool *)&local_a8,"p0 == p1","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x88);
        if (bVar3) {
          local_98._vptr_QPromiseBase._0_1_ =
               QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                         (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                         );
          local_a8.d._0_1_ = 1;
          bVar3 = QTest::qCompare<bool,bool>
                            ((bool *)&local_98,(bool *)&local_a8,"p0.isPending()","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x89);
          if (bVar3) {
            local_98._vptr_QPromiseBase._0_1_ =
                 QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                           (&(p1.super_QPromiseBase<void>.m_d.d)->
                             super_PromiseDataBase<void,_void_()>);
            local_a8.d._0_1_ = 1;
            bVar3 = QTest::qCompare<bool,bool>
                              ((bool *)&local_98,(bool *)&local_a8,"p1.isPending()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                               ,0x8a);
            if (bVar3) {
              QtPromise::QPromiseBase<void>::wait(&local_38,&p0);
              QtPromise::QPromiseBase<void>::~QPromiseBase(&local_38);
              local_98._vptr_QPromiseBase._0_1_ =
                   QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                             (&(p0.super_QPromiseBase<void>.m_d.d)->
                               super_PromiseDataBase<void,_void_()>);
              local_a8.d._0_1_ = 1;
              bVar3 = QTest::qCompare<bool,bool>
                                ((bool *)&local_98,(bool *)&local_a8,"p0.isFulfilled()","true",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                                 ,0x8e);
              if (bVar3) {
                local_98._vptr_QPromiseBase._0_1_ =
                     QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                               (&(p1.super_QPromiseBase<void>.m_d.d)->
                                 super_PromiseDataBase<void,_void_()>);
                local_a8.d._0_1_ = 1;
                QTest::qCompare<bool,bool>
                          ((bool *)&local_98,(bool *)&local_a8,"p1.isFulfilled()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x8f);
              }
            }
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p1.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p0.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_qpromise_operators::move()
{
    auto p0 = QtPromise::QPromise<int>::resolve(42);

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1), 42);

    p0 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve(43);
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1), 43);
}